

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::Promise<void>_> * __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::operator=
          (ArrayBuilder<kj::Promise<void>_> *this,ArrayBuilder<kj::Promise<void>_> *other)

{
  ArrayBuilder<kj::Promise<void>_> *other_local;
  ArrayBuilder<kj::Promise<void>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Promise<void> *)0x0;
  other->pos = (RemoveConst<kj::Promise<void>_> *)0x0;
  other->endPtr = (Promise<void> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }